

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getnameinfo.c
# Opt level: O1

void append_scopeid(sockaddr_in6 *addr6,uint flags,char *buf,size_t buflen)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  char tmpbuf [18];
  char local_38;
  char local_37 [16];
  undefined1 local_27;
  
  local_38 = '%';
  if ((addr6->sin6_addr).__in6_u.__u6_addr8[0] == 0xff) {
    bVar4 = ((addr6->sin6_addr).__in6_u.__u6_addr8[1] & 0xf) == 2;
  }
  else {
    bVar4 = false;
  }
  if ((((char)flags < '\0') ||
      (!(bool)(((addr6->sin6_addr).__in6_u.__u6_addr32[0] & 0xc0ff) == 0x80fe | bVar4))) ||
     (pcVar1 = if_indextoname(addr6->sin6_scope_id,local_37), pcVar1 == (char *)0x0)) {
    snprintf(local_37,0x11,"%lu",(ulong)addr6->sin6_scope_id);
  }
  local_27 = 0;
  sVar2 = ares_strlen(buf);
  sVar3 = ares_strlen(&local_38);
  if (sVar3 + sVar2 < 0x3e) {
    ares_strcpy(buf + sVar2,&local_38,0x3e - sVar2);
  }
  return;
}

Assistant:

static void append_scopeid(const struct sockaddr_in6 *addr6, unsigned int flags,
                           char *buf, size_t buflen)
{
#  ifdef HAVE_IF_INDEXTONAME
  int is_ll;
  int is_mcll;
#  endif
  char   tmpbuf[IF_NAMESIZE + 2];
  size_t bufl;

  tmpbuf[0] = '%';

#  ifdef HAVE_IF_INDEXTONAME
  is_ll   = IN6_IS_ADDR_LINKLOCAL(&addr6->sin6_addr);
  is_mcll = IN6_IS_ADDR_MC_LINKLOCAL(&addr6->sin6_addr);
  if ((flags & ARES_NI_NUMERICSCOPE) || (!is_ll && !is_mcll)) {
    snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
             (unsigned long)addr6->sin6_scope_id);
  } else {
    if (if_indextoname(addr6->sin6_scope_id, &tmpbuf[1]) == NULL) {
      snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
               (unsigned long)addr6->sin6_scope_id);
    }
  }
#  else
  snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
           (unsigned long)addr6->sin6_scope_id);
  (void)flags;
#  endif
  tmpbuf[IF_NAMESIZE + 1] = '\0';
  bufl                    = ares_strlen(buf);

  if (bufl + ares_strlen(tmpbuf) < buflen) {
    /* only append the scopeid string if it fits in the target buffer */
    ares_strcpy(&buf[bufl], tmpbuf, buflen - bufl);
  }
}